

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O1

void __thiscall
google::
dense_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
::set_empty_key(dense_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
                *this,key_type *key)

{
  int iVar1;
  undefined4 uVar2;
  size_type sVar3;
  pointer ppVar4;
  int *piVar5;
  size_type sVar6;
  int iVar7;
  
  (this->settings).super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  use_empty_ = true;
  iVar7 = g_num_copies + 1;
  iVar1 = key->i_;
  g_num_copies = iVar7;
  (this->key_info).empty_key.i_ = iVar1;
  *(undefined4 *)(this->key_info).empty_key.buffer_ = *(undefined4 *)key->buffer_;
  sVar3 = this->num_buckets;
  ppVar4 = (pointer)malloc(sVar3 * 0xc);
  this->table = ppVar4;
  if (sVar3 != 0) {
    uVar2 = *(undefined4 *)(this->key_info).empty_key.buffer_;
    piVar5 = &ppVar4->second;
    sVar6 = sVar3;
    do {
      (((pair<const_HashObject<8,_8>,_int> *)(piVar5 + -2))->first).i_ = iVar1;
      piVar5[-1] = uVar2;
      *piVar5 = 0;
      piVar5 = piVar5 + 3;
      sVar6 = sVar6 - 1;
    } while (sVar6 != 0);
    g_num_copies = iVar7 + (int)sVar3;
  }
  return;
}

Assistant:

void set_empty_key(const key_type& key) {
    // Once you set the empty key, you can't change it
    assert(!settings.use_empty() && "Calling set_empty_key multiple times");
    // The deleted indicator (if specified) and the empty indicator
    // must be different.
    assert(
        (!settings.use_deleted() || !equals(key, key_info.delkey)) &&
        "Setting the empty key the same as the deleted key");
    settings.set_use_empty(true);
    key_info.empty_key = key;

    assert(!table);  // must set before first use
    // num_buckets was set in constructor even though table was NULL
    table = val_info.allocate(num_buckets);
    assert(table);
    fill_range_with_empty(table, num_buckets);
  }